

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O1

CfgEdge * __thiscall CFG::findEdge(CFG *this,CfgNode *src,CfgNode *dst)

{
  bool bVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  CfgEdge *unaff_R12;
  CfgEdge *pCVar4;
  
  bVar2 = containsNode(this,src);
  if ((bVar2) && (bVar2 = containsNode(this,dst), bVar2)) {
    p_Var3 = (this->m_edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while (bVar2 = (_Rb_tree_header *)p_Var3 != &(this->m_edges)._M_t._M_impl.super__Rb_tree_header,
          pCVar4 = unaff_R12, bVar2) {
      pCVar4 = *(CfgEdge **)(p_Var3 + 1);
      if ((pCVar4->m_src == src) && (pCVar4->m_dst == dst)) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
        pCVar4 = unaff_R12;
      }
      if (!bVar1) break;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      unaff_R12 = pCVar4;
    }
    if (bVar2) {
      return pCVar4;
    }
  }
  return (CfgEdge *)0x0;
}

Assistant:

CfgEdge* CFG::findEdge(CfgNode* src, CfgNode* dst) const {
	if (this->containsNode(src) && this->containsNode(dst)) {
		for (CfgEdge* edge : this->edges()) {
			if (edge->source() == src && edge->destination() == dst)
				return edge;
		}
	}

	return 0;
}